

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::BitwiseNotFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  bool bVar3;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *function;
  iterator __end1_1;
  iterator __begin1_1;
  vector<duckdb::ScalarFunction,_true> *__range1_1;
  LogicalType *type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::LogicalType,_true> *__range1;
  ScalarFunctionSet *functions;
  ScalarFunction *in_stack_fffffffffffffa78;
  ScalarFunction *function_00;
  ScalarFunction *in_stack_fffffffffffffa80;
  ScalarFunction *this;
  LogicalType *in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  LogicalType *local_520;
  LogicalType *in_stack_fffffffffffffb28;
  BaseScalarFunction local_4b8 [176];
  reference local_408;
  ScalarFunction *local_400;
  __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
  local_3f8;
  ScalarFunctionSet *local_3f0;
  LogicalType local_3e8 [24];
  undefined1 local_3d0 [32];
  LogicalType local_3b0 [32];
  LogicalType *local_390;
  LogicalType local_388 [24];
  LogicalType *local_370;
  undefined8 local_368;
  undefined1 local_360 [24];
  ScalarFunction local_348;
  LogicalType local_220 [24];
  undefined1 local_208 [32];
  LogicalType local_1e8 [32];
  LogicalType *local_1c8;
  LogicalType local_1c0 [24];
  LogicalType *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [24];
  ScalarFunction local_180;
  reference local_58;
  LogicalType *local_50;
  __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
  local_48 [3];
  undefined1 local_30 [24];
  undefined1 *local_18;
  undefined1 local_9;
  
  local_9 = 0;
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::Integral();
  local_18 = local_30;
  local_48[0]._M_current =
       (LogicalType *)
       std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::begin
                 ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                  in_stack_fffffffffffffa78);
  local_50 = (LogicalType *)
             std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
                       ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                        in_stack_fffffffffffffa78);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                             *)in_stack_fffffffffffffa80,
                            (__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                             *)in_stack_fffffffffffffa78), bVar3) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
               ::operator*(local_48);
    local_1c8 = local_1c0;
    duckdb::LogicalType::LogicalType(local_1c8,local_58);
    local_1a8 = local_1c0;
    local_1a0 = 1;
    std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xe2fda1);
    iVar1._M_len._0_4_ = in_stack_fffffffffffffa90;
    iVar1._M_array = in_stack_fffffffffffffa88;
    iVar1._M_len._4_4_ = in_stack_fffffffffffffa94;
    vector<duckdb::LogicalType,_true>::vector
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffa80,iVar1,
               (allocator_type *)in_stack_fffffffffffffa78);
    duckdb::LogicalType::LogicalType(local_1e8,local_58);
    GetScalarIntegerUnaryFunction<duckdb::BitwiseNotOperator>(in_stack_fffffffffffffb28);
    duckdb::LogicalType::LogicalType(local_220,INVALID);
    in_stack_fffffffffffffa88 = local_220;
    in_stack_fffffffffffffa90 = 0;
    in_stack_fffffffffffffa80 = (ScalarFunction *)0x0;
    in_stack_fffffffffffffa78 = (ScalarFunction *)0x0;
    duckdb::ScalarFunction::ScalarFunction(&local_180,local_198,local_1e8,local_208,0);
    FunctionSet<duckdb::ScalarFunction>::AddFunction
              ((FunctionSet<duckdb::ScalarFunction> *)in_stack_fffffffffffffa80,
               in_stack_fffffffffffffa78);
    ScalarFunction::~ScalarFunction(in_stack_fffffffffffffa80);
    duckdb::LogicalType::~LogicalType(local_220);
    std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              0xe2fea8);
    duckdb::LogicalType::~LogicalType(local_1e8);
    vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe2fec2);
    std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xe2fecf);
    in_stack_fffffffffffffb28 = (LogicalType *)&local_1a8;
    do {
      in_stack_fffffffffffffb28 = in_stack_fffffffffffffb28 + -0x18;
      duckdb::LogicalType::~LogicalType(in_stack_fffffffffffffb28);
    } while (in_stack_fffffffffffffb28 != local_1c0);
    __gnu_cxx::
    __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
    ::operator++(local_48);
  }
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe2fd1e);
  local_390 = local_388;
  duckdb::LogicalType::LogicalType(local_390,BIT);
  local_370 = local_388;
  local_368 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xe30121);
  iVar2._M_len._0_4_ = in_stack_fffffffffffffa90;
  iVar2._M_array = in_stack_fffffffffffffa88;
  iVar2._M_len._4_4_ = in_stack_fffffffffffffa94;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffa80,iVar2,
             (allocator_type *)in_stack_fffffffffffffa78);
  duckdb::LogicalType::LogicalType(local_3b0,BIT);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)in_stack_fffffffffffffa88);
  duckdb::LogicalType::LogicalType(local_3e8,INVALID);
  this = (ScalarFunction *)0x0;
  function_00 = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_348,local_360,local_3b0,local_3d0,0);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,function_00);
  ScalarFunction::~ScalarFunction(this);
  duckdb::LogicalType::~LogicalType(local_3e8);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xe3021f);
  duckdb::LogicalType::~LogicalType(local_3b0);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe30239);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xe30246);
  local_520 = (LogicalType *)&local_370;
  do {
    local_520 = local_520 + -0x18;
    duckdb::LogicalType::~LogicalType(local_520);
  } while (local_520 != local_388);
  local_3f0 = in_RDI + 0x20;
  local_3f8._M_current =
       (ScalarFunction *)
       std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::begin
                 (function_00);
  local_400 = (ScalarFunction *)
              std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::end
                        ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                         function_00);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                             *)this,(__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                                     *)function_00), bVar3) {
    local_408 = __gnu_cxx::
                __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                ::operator*(&local_3f8);
    BaseScalarFunction::SetReturnsError(&function_00->super_BaseScalarFunction);
    duckdb::BaseScalarFunction::~BaseScalarFunction(local_4b8);
    __gnu_cxx::
    __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
    ::operator++(&local_3f8);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet BitwiseNotFun::GetFunctions() {
	ScalarFunctionSet functions;
	for (auto &type : LogicalType::Integral()) {
		functions.AddFunction(ScalarFunction({type}, type, GetScalarIntegerUnaryFunction<BitwiseNotOperator>(type)));
	}
	functions.AddFunction(ScalarFunction({LogicalType::BIT}, LogicalType::BIT, BitwiseNOTOperation));
	for (auto &function : functions.functions) {
		BaseScalarFunction::SetReturnsError(function);
	}
	return functions;
}